

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator * __thiscall
fmt::v5::
vformat_to<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
          (iterator *__return_storage_ptr__,v5 *this,range out,basic_string_view<wchar_t> format_str
          ,basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
           args,locale_ref loc)

{
  basic_string_view<wchar_t> format_str_00;
  undefined1 auStack_98 [8];
  v5 *local_90;
  wchar_t *local_88;
  undefined4 local_80;
  wchar_t *local_78;
  size_t sStack_70;
  size_t local_68;
  value_type_conflict vStack_60;
  undefined4 uStack_5c;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
  *local_58;
  unsigned_long_long local_50;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>_2
  local_48;
  void *local_40;
  undefined4 local_38;
  undefined4 local_28;
  undefined4 local_18;
  
  local_48 = args.field_1;
  local_50 = args.types_;
  local_58 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
              *)format_str.size_;
  local_88 = format_str.data_;
  local_68 = out.it_.super_truncating_iterator_base<wchar_t_*>.count_;
  vStack_60 = out.it_.blackhole_;
  uStack_5c = out.it_._28_4_;
  local_78 = out.it_.super_truncating_iterator_base<wchar_t_*>.out_;
  sStack_70 = out.it_.super_truncating_iterator_base<wchar_t_*>.limit_;
  local_80 = 0;
  local_40 = (void *)0x0;
  local_38 = 0;
  local_28 = 0;
  local_18 = 0;
  format_str_00.size_ = (size_t)auStack_98;
  format_str_00.data_ = local_88;
  local_90 = this;
  internal::
  parse_format_string<false,wchar_t,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>&>
            ((internal *)this,format_str_00,local_58);
  (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).count_ = local_68;
  __return_storage_ptr__->blackhole_ = vStack_60;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = uStack_5c;
  (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).out_ = local_78;
  (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).limit_ = sStack_70;
  if (local_40 != (void *)0x0) {
    operator_delete__(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

typename Context::iterator vformat_to(
    typename ArgFormatter::range out,
    basic_string_view<Char> format_str,
    basic_format_args<Context> args,
    internal::locale_ref loc = internal::locale_ref()) {
  format_handler<ArgFormatter, Char, Context> h(out, format_str, args, loc);
  internal::parse_format_string<false>(format_str, h);
  return h.context.out();
}